

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O3

void __thiscall
cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::
process<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&>
          (OutputArchive<cereal::PortableBinaryOutputArchive,1u> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *head,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_1,int *tail_2)

{
  long lVar1;
  long lVar2;
  size_type local_40;
  int *local_38;
  
  lVar1 = *(long *)(*(long *)(*(long *)(this + 8) + 8) + 8);
  local_40 = head->_M_string_length;
  local_38 = tail_2;
  PortableBinaryOutputArchive::saveBinary<8ul>
            (*(PortableBinaryOutputArchive **)
              (*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(lVar1 + 8) + 8) + 8) + 8) + 8) + 8)
             ,&local_40,8);
  PortableBinaryOutputArchive::saveBinary<1ul>
            (*(PortableBinaryOutputArchive **)(*(long *)(*(long *)(lVar1 + 8) + 8) + 8),
             (head->_M_dataplus)._M_p,head->_M_string_length);
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(*(long *)(*(long *)(lVar1 + 8) + 8) + 8);
  local_40 = tail->_M_string_length;
  PortableBinaryOutputArchive::saveBinary<8ul>
            (*(PortableBinaryOutputArchive **)
              (*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(lVar2 + 8) + 8) + 8) + 8) + 8) + 8)
             ,&local_40,8);
  PortableBinaryOutputArchive::saveBinary<1ul>
            (*(PortableBinaryOutputArchive **)(*(long *)(*(long *)(lVar2 + 8) + 8) + 8),
             (tail->_M_dataplus)._M_p,tail->_M_string_length);
  lVar1 = *(long *)(lVar1 + 8);
  lVar2 = *(long *)(*(long *)(*(long *)(lVar1 + 8) + 8) + 8);
  local_40 = tail_1->_M_string_length;
  PortableBinaryOutputArchive::saveBinary<8ul>
            (*(PortableBinaryOutputArchive **)
              (*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(lVar2 + 8) + 8) + 8) + 8) + 8) + 8)
             ,&local_40,8);
  PortableBinaryOutputArchive::saveBinary<1ul>
            (*(PortableBinaryOutputArchive **)(*(long *)(*(long *)(lVar2 + 8) + 8) + 8),
             (tail_1->_M_dataplus)._M_p,tail_1->_M_string_length);
  PortableBinaryOutputArchive::saveBinary<4ul>
            (*(PortableBinaryOutputArchive **)(*(long *)(*(long *)(lVar1 + 8) + 8) + 8),local_38,4);
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        self->process( std::forward<T>( head ) );
        self->process( std::forward<Other>( tail )... );
      }